

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ImGui::ShowStyleEditor(ImGuiStyle *ref)

{
  ImVec4 IVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ImVec2 IVar6;
  undefined1 auVar7 [11];
  undefined1 auVar8 [11];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  bool bVar15;
  int iVar16;
  ImGuiStyle *__src;
  char *__s;
  size_t sVar17;
  ImVec4 *pIVar18;
  ImDrawList *pIVar19;
  ImVec4 *pIVar20;
  ImGuiStyle *in_RDI;
  undefined1 extraout_XMM0_Ba;
  char cVar21;
  undefined1 extraout_XMM0_Bb;
  char cVar22;
  undefined1 extraout_XMM0_Bc;
  char cVar23;
  undefined1 extraout_XMM0_Bd;
  char cVar24;
  undefined1 extraout_XMM0_Be;
  char cVar25;
  undefined1 extraout_XMM0_Bf;
  char cVar26;
  undefined1 extraout_XMM0_Bg;
  char cVar27;
  undefined1 extraout_XMM0_Bh;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  byte bVar36;
  bool *unaff_retaddr;
  char *in_stack_00000008;
  ImVec2 p1;
  float offset_y;
  float offset_x;
  float canvas_width;
  float rad;
  float RAD_MAX;
  float RAD_MIN;
  int n;
  float min_widget_width;
  ImDrawList *draw_list;
  float MAX_SCALE;
  float MIN_SCALE;
  ImFontAtlas *atlas;
  ImGuiIO *io;
  char *name_1;
  int i_1;
  float *in_stack_000000e0;
  char *name;
  ImVec4 *col;
  int i;
  int window_menu_button_position;
  bool border_2;
  bool border_1;
  bool border;
  ImGuiStyle *style;
  ImDrawList *in_stack_fffffffffffffec8;
  ImGuiSliderFlags flags;
  float in_stack_fffffffffffffed0;
  float in_stack_fffffffffffffed4;
  ImDrawList *in_stack_fffffffffffffed8;
  ImGuiTextFilter *in_stack_fffffffffffffee0;
  ImGuiTextFilter *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  char *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  float fVar37;
  float local_f4;
  undefined4 in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int local_b8;
  float local_b4;
  undefined1 local_a0 [8];
  ImVec2 local_98;
  char local_90 [8];
  ImFontAtlas *local_88;
  ImGuiIO *local_80;
  ImVec2 local_78;
  int local_5c;
  ImVec2 local_58;
  char *local_50;
  ImVec4 *local_48;
  int local_40;
  ImVec2 local_3c;
  int local_34;
  ImVec2 local_30;
  ImVec2 local_28;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  char in_stack_ffffffffffffffe7;
  char *in_stack_ffffffffffffffe8;
  ImGuiStyle *local_8;
  
  if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
    (*GImGuiDemoMarkerCallback)
              ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
               ,0x17d2,"Tools/Style Editor",GImGuiDemoMarkerCallbackUserData);
  }
  __src = GetStyle();
  if ((ShowStyleEditor(ImGuiStyle*)::ref_saved_style == '\0') &&
     (iVar16 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style), iVar16 != 0)) {
    ImGuiStyle::ImGuiStyle
              ((ImGuiStyle *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
  }
  if (((ShowStyleEditor::init & 1U) != 0) && (in_RDI == (ImGuiStyle *)0x0)) {
    memcpy(&ShowStyleEditor::ref_saved_style,__src,0x418);
  }
  ShowStyleEditor::init = false;
  local_8 = in_RDI;
  if (in_RDI == (ImGuiStyle *)0x0) {
    local_8 = &ShowStyleEditor::ref_saved_style;
  }
  GetWindowWidth();
  PushItemWidth((float)((ulong)in_stack_fffffffffffffee0 >> 0x20));
  bVar15 = ShowStyleSelector((char *)in_stack_fffffffffffffec8);
  if (bVar15) {
    memcpy(&ShowStyleEditor::ref_saved_style,__src,0x418);
  }
  ShowFontSelector((char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  bVar15 = SliderFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       (float *)in_stack_fffffffffffffee8,
                       (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                       SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                       (ImGuiSliderFlags)in_stack_fffffffffffffed4);
  if (bVar15) {
    __src->GrabRounding = __src->FrameRounding;
  }
  local_1d = 0.0 < __src->WindowBorderSize;
  bVar15 = Checkbox(in_stack_00000008,unaff_retaddr);
  if (bVar15) {
    in_stack_ffffffffffffff10 = 0;
    in_stack_ffffffffffffff14 = 1.0;
    if ((local_1d & 1) == 0) {
      in_stack_ffffffffffffff14 = 0.0;
    }
    __src->WindowBorderSize = in_stack_ffffffffffffff14;
  }
  SameLine(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
  local_1e = 0.0 < __src->FrameBorderSize;
  bVar15 = Checkbox(in_stack_00000008,unaff_retaddr);
  if (bVar15) {
    local_f4 = 1.0;
    if ((local_1e & 1) == 0) {
      local_f4 = 0.0;
    }
    __src->FrameBorderSize = local_f4;
  }
  SameLine(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
  local_1f = 0.0 < __src->PopupBorderSize;
  bVar15 = Checkbox(in_stack_00000008,unaff_retaddr);
  if (bVar15) {
    fVar37 = 1.0;
    if ((local_1f & 1) == 0) {
      fVar37 = 0.0;
    }
    __src->PopupBorderSize = fVar37;
  }
  ImVec2::ImVec2(&local_28,0.0,0.0);
  bVar15 = Button((char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                  (ImVec2 *)in_stack_fffffffffffffec8);
  if (bVar15) {
    memcpy(&ShowStyleEditor::ref_saved_style,__src,0x418);
    memcpy(local_8,&ShowStyleEditor::ref_saved_style,0x418);
  }
  SameLine(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
  ImVec2::ImVec2(&local_30,0.0,0.0);
  bVar15 = Button((char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                  (ImVec2 *)in_stack_fffffffffffffec8);
  if (bVar15) {
    memcpy(__src,local_8,0x418);
  }
  SameLine(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
  HelpMarker((char *)0x16a2a0);
  Separator();
  bVar15 = BeginTabBar(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
  if (bVar15) {
    bVar15 = BeginTabItem(in_stack_fffffffffffffef8,
                          (bool *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          (ImGuiTabItemFlags)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    if (bVar15) {
      Text("Main");
      SliderFloat2((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (float *)in_stack_fffffffffffffee8,
                   (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                   SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                   (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      SliderFloat2((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (float *)in_stack_fffffffffffffee8,
                   (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                   SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                   (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      SliderFloat2((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (float *)in_stack_fffffffffffffee8,
                   (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                   SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                   (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      SliderFloat2((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (float *)in_stack_fffffffffffffee8,
                   (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                   SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                   (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      SliderFloat2((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (float *)in_stack_fffffffffffffee8,
                   (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                   SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                   (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      SliderFloat2((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (float *)in_stack_fffffffffffffee8,
                   (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                   SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                   (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      SliderFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  (float *)in_stack_fffffffffffffee8,
                  (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                  SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                  (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      SliderFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  (float *)in_stack_fffffffffffffee8,
                  (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                  SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                  (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      SliderFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  (float *)in_stack_fffffffffffffee8,
                  (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                  SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                  (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      Text("Borders");
      SliderFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  (float *)in_stack_fffffffffffffee8,
                  (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                  SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                  (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      SliderFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  (float *)in_stack_fffffffffffffee8,
                  (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                  SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                  (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      SliderFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  (float *)in_stack_fffffffffffffee8,
                  (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                  SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                  (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      SliderFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  (float *)in_stack_fffffffffffffee8,
                  (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                  SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                  (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      SliderFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  (float *)in_stack_fffffffffffffee8,
                  (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                  SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                  (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      Text("Rounding");
      SliderFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  (float *)in_stack_fffffffffffffee8,
                  (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                  SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                  (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      SliderFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  (float *)in_stack_fffffffffffffee8,
                  (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                  SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                  (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      SliderFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  (float *)in_stack_fffffffffffffee8,
                  (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                  SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                  (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      SliderFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  (float *)in_stack_fffffffffffffee8,
                  (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                  SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                  (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      SliderFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  (float *)in_stack_fffffffffffffee8,
                  (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                  SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                  (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      SliderFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  (float *)in_stack_fffffffffffffee8,
                  (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                  SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                  (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      SliderFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  (float *)in_stack_fffffffffffffee8,
                  (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                  SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                  (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      SliderFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  (float *)in_stack_fffffffffffffee8,
                  (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                  SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                  (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      Text("Alignment");
      SliderFloat2((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (float *)in_stack_fffffffffffffee8,
                   (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                   SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                   (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      local_34 = __src->WindowMenuButtonPosition + 1;
      bVar15 = Combo((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (int *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0->InputBuf,
                     (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      if (bVar15) {
        __src->WindowMenuButtonPosition = local_34 + -1;
      }
      Combo((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
            (int *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0->InputBuf,
            (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      SliderFloat2((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (float *)in_stack_fffffffffffffee8,
                   (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                   SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                   (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      SameLine(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
      HelpMarker((char *)0x16a7db);
      SliderFloat2((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (float *)in_stack_fffffffffffffee8,
                   (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                   SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                   (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      SameLine(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
      HelpMarker((char *)0x16a826);
      Text("Safe Area Padding");
      SameLine(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
      HelpMarker((char *)0x16a850);
      SliderFloat2((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (float *)in_stack_fffffffffffffee8,
                   (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                   SUB84(in_stack_fffffffffffffee0,0),(char *)in_stack_fffffffffffffed8,
                   (ImGuiSliderFlags)in_stack_fffffffffffffed4);
      EndTabItem();
    }
    bVar15 = BeginTabItem(in_stack_fffffffffffffef8,
                          (bool *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          (ImGuiTabItemFlags)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    if (bVar15) {
      ImVec2::ImVec2(&local_3c,0.0,0.0);
      bVar15 = Button((char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                      (ImVec2 *)in_stack_fffffffffffffec8);
      if (bVar15) {
        if (ShowStyleEditor::output_dest == 0) {
          LogToClipboard((int)in_stack_fffffffffffffed4);
        }
        else {
          LogToTTY((int)in_stack_fffffffffffffed4);
        }
        LogText("ImVec4* colors = ImGui::GetStyle().Colors;\n");
        for (local_40 = 0; local_40 < 0x35; local_40 = local_40 + 1) {
          local_48 = __src->Colors + local_40;
          __s = GetStyleColorName(local_40);
          local_50 = __s;
          if ((ShowStyleEditor::output_only_modified & 1U) == 0) {
LAB_0016a99b:
            sVar17 = strlen(__s);
            LogText((char *)CONCAT17(extraout_XMM0_Bh,
                                     CONCAT16(extraout_XMM0_Bg,
                                              CONCAT15(extraout_XMM0_Bf,
                                                       CONCAT14(extraout_XMM0_Be,
                                                                CONCAT13(extraout_XMM0_Bd,
                                                                         CONCAT12(extraout_XMM0_Bc,
                                                                                  CONCAT11(
                                                  extraout_XMM0_Bb,extraout_XMM0_Ba))))))),
                    (double)local_48->y,(double)local_48->z,(double)local_48->w,
                    "colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);\n",__s,
                    (ulong)(0x17 - (int)sVar17),"");
            in_stack_fffffffffffffef8 = __s;
          }
          else {
            IVar1 = local_8->Colors[local_40];
            cVar21 = -(*(char *)&local_48->x == IVar1.x._0_1_);
            cVar22 = -(*(undefined1 *)((long)&local_48->x + 1) == IVar1.x._1_1_);
            cVar23 = -(*(undefined1 *)((long)&local_48->x + 2) == IVar1.x._2_1_);
            cVar24 = -(*(undefined1 *)((long)&local_48->x + 3) == IVar1.x._3_1_);
            cVar25 = -(*(char *)&local_48->y == IVar1.y._0_1_);
            cVar26 = -(*(undefined1 *)((long)&local_48->y + 1) == IVar1.y._1_1_);
            cVar27 = -(*(undefined1 *)((long)&local_48->y + 2) == IVar1.y._2_1_);
            cVar28 = -(*(undefined1 *)((long)&local_48->y + 3) == IVar1.y._3_1_);
            cVar29 = -(*(char *)&local_48->z == IVar1.z._0_1_);
            cVar30 = -(*(undefined1 *)((long)&local_48->z + 1) == IVar1.z._1_1_);
            cVar31 = -(*(undefined1 *)((long)&local_48->z + 2) == IVar1.z._2_1_);
            cVar32 = -(*(undefined1 *)((long)&local_48->z + 3) == IVar1.z._3_1_);
            cVar33 = -(*(char *)&local_48->w == IVar1.w._0_1_);
            cVar34 = -(*(undefined1 *)((long)&local_48->w + 1) == IVar1.w._1_1_);
            cVar35 = -(*(undefined1 *)((long)&local_48->w + 2) == IVar1.w._2_1_);
            bVar36 = -(*(undefined1 *)((long)&local_48->w + 3) == IVar1.w._3_1_);
            auVar4[1] = cVar22;
            auVar4[0] = cVar21;
            auVar4[2] = cVar23;
            auVar4[3] = cVar24;
            auVar4[4] = cVar25;
            auVar4[5] = cVar26;
            auVar4[6] = cVar27;
            auVar4[7] = cVar28;
            auVar4[8] = cVar29;
            auVar4[9] = cVar30;
            auVar4[10] = cVar31;
            auVar4[0xb] = cVar32;
            auVar4[0xc] = cVar33;
            auVar4[0xd] = cVar34;
            auVar4[0xe] = cVar35;
            auVar4[0xf] = bVar36;
            auVar5[1] = cVar22;
            auVar5[0] = cVar21;
            auVar5[2] = cVar23;
            auVar5[3] = cVar24;
            auVar5[4] = cVar25;
            auVar5[5] = cVar26;
            auVar5[6] = cVar27;
            auVar5[7] = cVar28;
            auVar5[8] = cVar29;
            auVar5[9] = cVar30;
            auVar5[10] = cVar31;
            auVar5[0xb] = cVar32;
            auVar5[0xc] = cVar33;
            auVar5[0xd] = cVar34;
            auVar5[0xe] = cVar35;
            auVar5[0xf] = bVar36;
            auVar13[1] = cVar24;
            auVar13[0] = cVar23;
            auVar13[2] = cVar25;
            auVar13[3] = cVar26;
            auVar13[4] = cVar27;
            auVar13[5] = cVar28;
            auVar13[6] = cVar29;
            auVar13[7] = cVar30;
            auVar13[8] = cVar31;
            auVar13[9] = cVar32;
            auVar13[10] = cVar33;
            auVar13[0xb] = cVar34;
            auVar13[0xc] = cVar35;
            auVar13[0xd] = bVar36;
            auVar11[1] = cVar25;
            auVar11[0] = cVar24;
            auVar11[2] = cVar26;
            auVar11[3] = cVar27;
            auVar11[4] = cVar28;
            auVar11[5] = cVar29;
            auVar11[6] = cVar30;
            auVar11[7] = cVar31;
            auVar11[8] = cVar32;
            auVar11[9] = cVar33;
            auVar11[10] = cVar34;
            auVar11[0xb] = cVar35;
            auVar11[0xc] = bVar36;
            auVar9[1] = cVar26;
            auVar9[0] = cVar25;
            auVar9[2] = cVar27;
            auVar9[3] = cVar28;
            auVar9[4] = cVar29;
            auVar9[5] = cVar30;
            auVar9[6] = cVar31;
            auVar9[7] = cVar32;
            auVar9[8] = cVar33;
            auVar9[9] = cVar34;
            auVar9[10] = cVar35;
            auVar9[0xb] = bVar36;
            auVar7[1] = cVar27;
            auVar7[0] = cVar26;
            auVar7[2] = cVar28;
            auVar7[3] = cVar29;
            auVar7[4] = cVar30;
            auVar7[5] = cVar31;
            auVar7[6] = cVar32;
            auVar7[7] = cVar33;
            auVar7[8] = cVar34;
            auVar7[9] = cVar35;
            auVar7[10] = bVar36;
            if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB141(auVar13 >> 7,0) & 1) << 2 |
                         (ushort)(SUB131(auVar11 >> 7,0) & 1) << 3 |
                         (ushort)(SUB121(auVar9 >> 7,0) & 1) << 4 |
                         (ushort)(SUB111(auVar7 >> 7,0) & 1) << 5 |
                         (ushort)((byte)(CONCAT19(bVar36,CONCAT18(cVar35,CONCAT17(cVar34,CONCAT16(
                                                  cVar33,CONCAT15(cVar32,CONCAT14(cVar31,CONCAT13(
                                                  cVar30,CONCAT12(cVar29,CONCAT11(cVar28,cVar27)))))
                                                  )))) >> 7) & 1) << 6 |
                         (ushort)((byte)(CONCAT18(bVar36,CONCAT17(cVar35,CONCAT16(cVar34,CONCAT15(
                                                  cVar33,CONCAT14(cVar32,CONCAT13(cVar31,CONCAT12(
                                                  cVar30,CONCAT11(cVar29,cVar28)))))))) >> 7) & 1)
                         << 7 | (ushort)(bVar36 >> 7) << 0xf) != 0xffff) goto LAB_0016a99b;
          }
        }
        LogFinish();
      }
      SameLine(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
      SetNextItemWidth(120.0);
      Combo((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
            (int *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0->InputBuf,
            (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      SameLine(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
      Checkbox(in_stack_00000008,unaff_retaddr);
      if ((ShowStyleEditor(ImGuiStyle*)::filter == '\0') &&
         (iVar16 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::filter), iVar16 != 0)) {
        ImGuiTextFilter::ImGuiTextFilter
                  ((ImGuiTextFilter *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffee8->InputBuf);
        __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,&ShowStyleEditor::filter,&__dso_handle);
        __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::filter);
      }
      GetFontSize();
      ImGuiTextFilter::Draw
                (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
                 in_stack_fffffffffffffed4);
      bVar15 = RadioButton(in_stack_ffffffffffffffe8,(bool)in_stack_ffffffffffffffe7);
      if (bVar15) {
        ShowStyleEditor::alpha_flags = 0;
      }
      SameLine(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
      bVar15 = RadioButton(in_stack_ffffffffffffffe8,(bool)in_stack_ffffffffffffffe7);
      if (bVar15) {
        ShowStyleEditor::alpha_flags = 0x20000;
      }
      SameLine(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
      bVar15 = RadioButton(in_stack_ffffffffffffffe8,(bool)in_stack_ffffffffffffffe7);
      if (bVar15) {
        ShowStyleEditor::alpha_flags = 0x40000;
      }
      SameLine(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
      HelpMarker((char *)0x16abfb);
      ImVec2::ImVec2(&local_58,0.0,0.0);
      BeginChild(in_stack_fffffffffffffee0->InputBuf,(ImVec2 *)in_stack_fffffffffffffed8,
                 SUB41((uint)in_stack_fffffffffffffed4 >> 0x18,0),
                 (ImGuiWindowFlags)in_stack_fffffffffffffed0);
      PushItemWidth((float)((ulong)in_stack_fffffffffffffee0 >> 0x20));
      for (local_5c = 0; local_5c < 0x35; local_5c = local_5c + 1) {
        GetStyleColorName(local_5c);
        bVar15 = ImGuiTextFilter::PassFilter
                           (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0->InputBuf,
                            (char *)in_stack_fffffffffffffed8);
        if (bVar15) {
          PushID((int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
          ColorEdit4(name,in_stack_000000e0,i_1);
          pIVar18 = __src->Colors + local_5c;
          IVar1 = local_8->Colors[local_5c];
          cVar21 = -(*(char *)&pIVar18->x == IVar1.x._0_1_);
          cVar22 = -(*(undefined1 *)((long)&pIVar18->x + 1) == IVar1.x._1_1_);
          cVar23 = -(*(undefined1 *)((long)&pIVar18->x + 2) == IVar1.x._2_1_);
          cVar24 = -(*(undefined1 *)((long)&pIVar18->x + 3) == IVar1.x._3_1_);
          cVar25 = -(*(char *)&pIVar18->y == IVar1.y._0_1_);
          cVar26 = -(*(undefined1 *)((long)&pIVar18->y + 1) == IVar1.y._1_1_);
          cVar27 = -(*(undefined1 *)((long)&pIVar18->y + 2) == IVar1.y._2_1_);
          cVar28 = -(*(undefined1 *)((long)&pIVar18->y + 3) == IVar1.y._3_1_);
          cVar29 = -(*(char *)&pIVar18->z == IVar1.z._0_1_);
          cVar30 = -(*(undefined1 *)((long)&pIVar18->z + 1) == IVar1.z._1_1_);
          cVar31 = -(*(undefined1 *)((long)&pIVar18->z + 2) == IVar1.z._2_1_);
          cVar32 = -(*(undefined1 *)((long)&pIVar18->z + 3) == IVar1.z._3_1_);
          cVar33 = -(*(char *)&pIVar18->w == IVar1.w._0_1_);
          cVar34 = -(*(undefined1 *)((long)&pIVar18->w + 1) == IVar1.w._1_1_);
          cVar35 = -(*(undefined1 *)((long)&pIVar18->w + 2) == IVar1.w._2_1_);
          bVar36 = -(*(undefined1 *)((long)&pIVar18->w + 3) == IVar1.w._3_1_);
          auVar2[1] = cVar22;
          auVar2[0] = cVar21;
          auVar2[2] = cVar23;
          auVar2[3] = cVar24;
          auVar2[4] = cVar25;
          auVar2[5] = cVar26;
          auVar2[6] = cVar27;
          auVar2[7] = cVar28;
          auVar2[8] = cVar29;
          auVar2[9] = cVar30;
          auVar2[10] = cVar31;
          auVar2[0xb] = cVar32;
          auVar2[0xc] = cVar33;
          auVar2[0xd] = cVar34;
          auVar2[0xe] = cVar35;
          auVar2[0xf] = bVar36;
          auVar3[1] = cVar22;
          auVar3[0] = cVar21;
          auVar3[2] = cVar23;
          auVar3[3] = cVar24;
          auVar3[4] = cVar25;
          auVar3[5] = cVar26;
          auVar3[6] = cVar27;
          auVar3[7] = cVar28;
          auVar3[8] = cVar29;
          auVar3[9] = cVar30;
          auVar3[10] = cVar31;
          auVar3[0xb] = cVar32;
          auVar3[0xc] = cVar33;
          auVar3[0xd] = cVar34;
          auVar3[0xe] = cVar35;
          auVar3[0xf] = bVar36;
          auVar14[1] = cVar24;
          auVar14[0] = cVar23;
          auVar14[2] = cVar25;
          auVar14[3] = cVar26;
          auVar14[4] = cVar27;
          auVar14[5] = cVar28;
          auVar14[6] = cVar29;
          auVar14[7] = cVar30;
          auVar14[8] = cVar31;
          auVar14[9] = cVar32;
          auVar14[10] = cVar33;
          auVar14[0xb] = cVar34;
          auVar14[0xc] = cVar35;
          auVar14[0xd] = bVar36;
          auVar12[1] = cVar25;
          auVar12[0] = cVar24;
          auVar12[2] = cVar26;
          auVar12[3] = cVar27;
          auVar12[4] = cVar28;
          auVar12[5] = cVar29;
          auVar12[6] = cVar30;
          auVar12[7] = cVar31;
          auVar12[8] = cVar32;
          auVar12[9] = cVar33;
          auVar12[10] = cVar34;
          auVar12[0xb] = cVar35;
          auVar12[0xc] = bVar36;
          auVar10[1] = cVar26;
          auVar10[0] = cVar25;
          auVar10[2] = cVar27;
          auVar10[3] = cVar28;
          auVar10[4] = cVar29;
          auVar10[5] = cVar30;
          auVar10[6] = cVar31;
          auVar10[7] = cVar32;
          auVar10[8] = cVar33;
          auVar10[9] = cVar34;
          auVar10[10] = cVar35;
          auVar10[0xb] = bVar36;
          auVar8[1] = cVar27;
          auVar8[0] = cVar26;
          auVar8[2] = cVar28;
          auVar8[3] = cVar29;
          auVar8[4] = cVar30;
          auVar8[5] = cVar31;
          auVar8[6] = cVar32;
          auVar8[7] = cVar33;
          auVar8[8] = cVar34;
          auVar8[9] = cVar35;
          auVar8[10] = bVar36;
          if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB141(auVar14 >> 7,0) & 1) << 2 |
                       (ushort)(SUB131(auVar12 >> 7,0) & 1) << 3 |
                       (ushort)(SUB121(auVar10 >> 7,0) & 1) << 4 |
                       (ushort)(SUB111(auVar8 >> 7,0) & 1) << 5 |
                       (ushort)((byte)(CONCAT19(bVar36,CONCAT18(cVar35,CONCAT17(cVar34,CONCAT16(
                                                  cVar33,CONCAT15(cVar32,CONCAT14(cVar31,CONCAT13(
                                                  cVar30,CONCAT12(cVar29,CONCAT11(cVar28,cVar27)))))
                                                  )))) >> 7) & 1) << 6 |
                       (ushort)((byte)(CONCAT18(bVar36,CONCAT17(cVar35,CONCAT16(cVar34,CONCAT15(
                                                  cVar33,CONCAT14(cVar32,CONCAT13(cVar31,CONCAT12(
                                                  cVar30,CONCAT11(cVar29,cVar28)))))))) >> 7) & 1)
                       << 7 | (ushort)(bVar36 >> 7) << 0xf) != 0xffff) {
            SameLine(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
            ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff90,0.0,0.0);
            bVar15 = Button((char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            (ImVec2 *)in_stack_fffffffffffffec8);
            if (bVar15) {
              pIVar20 = __src->Colors + local_5c;
              pIVar18 = local_8->Colors + local_5c;
              fVar37 = pIVar20->y;
              pIVar18->x = pIVar20->x;
              pIVar18->y = fVar37;
              fVar37 = pIVar20->w;
              pIVar18->z = pIVar20->z;
              pIVar18->w = fVar37;
            }
            SameLine(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
            ImVec2::ImVec2(&local_78,0.0,0.0);
            bVar15 = Button((char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            (ImVec2 *)in_stack_fffffffffffffec8);
            if (bVar15) {
              pIVar20 = local_8->Colors + local_5c;
              pIVar18 = __src->Colors + local_5c;
              fVar37 = pIVar20->y;
              pIVar18->x = pIVar20->x;
              pIVar18->y = fVar37;
              fVar37 = pIVar20->w;
              pIVar18->z = pIVar20->z;
              pIVar18->w = fVar37;
            }
          }
          SameLine(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
          TextUnformatted((char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                          (char *)in_stack_fffffffffffffec8);
          PopID();
        }
      }
      PopItemWidth();
      EndChild();
      EndTabItem();
    }
    bVar15 = BeginTabItem(in_stack_fffffffffffffef8,
                          (bool *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          (ImGuiTabItemFlags)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    if (bVar15) {
      local_80 = GetIO();
      local_88 = local_80->Fonts;
      HelpMarker((char *)0x16aed6);
      ShowFontAtlas((ImFontAtlas *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      local_90[4] = -0x66;
      local_90[5] = -0x67;
      local_90[6] = -0x67;
      local_90[7] = '>';
      local_90[0] = '\0';
      local_90[1] = '\0';
      local_90[2] = '\0';
      local_90[3] = '@';
      HelpMarker((char *)0x16af11);
      GetFontSize();
      PushItemWidth((float)((ulong)in_stack_fffffffffffffee0 >> 0x20));
      bVar15 = DragFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         (float *)in_stack_fffffffffffffee8,
                         (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                         SUB84(in_stack_fffffffffffffee0,0),
                         (float)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                         (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      if (bVar15) {
        SetWindowFontScale(in_stack_fffffffffffffed4);
      }
      DragFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                (float *)in_stack_fffffffffffffee8,(float)((ulong)in_stack_fffffffffffffee0 >> 0x20)
                ,SUB84(in_stack_fffffffffffffee0,0),
                (float)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      PopItemWidth();
      EndTabItem();
    }
    bVar15 = BeginTabItem(in_stack_fffffffffffffef8,
                          (bool *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          (ImGuiTabItemFlags)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    if (bVar15) {
      Checkbox(in_stack_00000008,unaff_retaddr);
      SameLine(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
      HelpMarker((char *)0x16b009);
      Checkbox(in_stack_00000008,unaff_retaddr);
      SameLine(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
      HelpMarker((char *)0x16b040);
      Checkbox(in_stack_00000008,unaff_retaddr);
      GetFontSize();
      PushItemWidth((float)((ulong)in_stack_fffffffffffffee0 >> 0x20));
      DragFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                (float *)in_stack_fffffffffffffee8,(float)((ulong)in_stack_fffffffffffffee0 >> 0x20)
                ,SUB84(in_stack_fffffffffffffee0,0),
                (float)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      if (__src->CurveTessellationTol <= 0.1 && __src->CurveTessellationTol != 0.1) {
        __src->CurveTessellationTol = 0.1;
      }
      DragFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                (float *)in_stack_fffffffffffffee8,(float)((ulong)in_stack_fffffffffffffee0 >> 0x20)
                ,SUB84(in_stack_fffffffffffffee0,0),
                (float)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      bVar15 = IsItemActive();
      fVar37 = (float)((ulong)in_stack_fffffffffffffed8 >> 0x20);
      if (bVar15) {
        local_98 = GetCursorScreenPos();
        in_stack_fffffffffffffee0 = (ImGuiTextFilter *)local_a0;
        ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffee0,0.0,0.0);
        in_stack_fffffffffffffef4 = 0;
        SetNextWindowPos(&local_98,0,(ImVec2 *)in_stack_fffffffffffffee0);
        BeginTooltip();
        in_stack_fffffffffffffee8 = (ImGuiTextFilter *)(ulong)in_stack_fffffffffffffef4;
        TextUnformatted((char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (char *)in_stack_fffffffffffffec8);
        Spacing();
        pIVar19 = GetWindowDrawList();
        IVar6 = CalcTextSize(in_stack_fffffffffffffef8,
                             (char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                             SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0),
                             SUB84(in_stack_fffffffffffffee8,0));
        local_b4 = IVar6.x;
        for (local_b8 = 0; fVar37 = (float)((ulong)in_stack_fffffffffffffed8 >> 0x20), local_b8 < 8;
            local_b8 = local_b8 + 1) {
          local_c4 = ((float)local_b8 * 65.0) / 7.0 + 5.0;
          BeginGroup();
          in_stack_fffffffffffffed8 = (ImDrawList *)(double)local_c4;
          iVar16 = ImDrawList::_CalcCircleAutoSegmentCount
                             (in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
          Text("R: %.f\nN: %d",iVar16);
          in_stack_fffffffffffffed4 = local_b4;
          if (local_b4 < local_c4 * 2.0) {
            in_stack_fffffffffffffed4 = local_c4 * 2.0;
          }
          local_c8 = in_stack_fffffffffffffed4;
          local_cc = floorf(in_stack_fffffffffffffed4 * 0.5);
          local_d0 = 70.0;
          local_d8 = GetCursorScreenPos();
          in_stack_fffffffffffffec8 = pIVar19;
          ImVec2::ImVec2(&local_e0,local_d8.x + local_cc,local_d8.y + local_d0);
          in_stack_fffffffffffffed0 = local_c4;
          GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                      SUB84(in_stack_fffffffffffffee0,0));
          ImDrawList::AddCircle
                    ((ImDrawList *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (ImVec2 *)in_stack_fffffffffffffee8,
                     (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                     (ImU32)in_stack_fffffffffffffee0,
                     (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                     SUB84(in_stack_fffffffffffffed8,0));
          ImVec2::ImVec2(&local_e8,local_c8,140.0);
          Dummy((ImVec2 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
          EndGroup();
          SameLine(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
        }
        EndTooltip();
      }
      flags = (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffec8 >> 0x20);
      SameLine(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
      HelpMarker((char *)0x16b3c9);
      DragFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                (float *)in_stack_fffffffffffffee8,(float)((ulong)in_stack_fffffffffffffee0 >> 0x20)
                ,SUB84(in_stack_fffffffffffffee0,0),fVar37,
                (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),flags);
      DragFloat((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                (float *)in_stack_fffffffffffffee8,(float)((ulong)in_stack_fffffffffffffee0 >> 0x20)
                ,SUB84(in_stack_fffffffffffffee0,0),fVar37,
                (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),flags);
      SameLine(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
      HelpMarker((char *)0x16b44e);
      PopItemWidth();
      EndTabItem();
    }
    EndTabBar();
  }
  PopItemWidth();
  return;
}

Assistant:

void ImGui::ShowStyleEditor(ImGuiStyle* ref)
{
    IMGUI_DEMO_MARKER("Tools/Style Editor");
    // You can pass in a reference ImGuiStyle structure to compare to, revert to and save to
    // (without a reference style pointer, we will use one compared locally as a reference)
    ImGuiStyle& style = ImGui::GetStyle();
    static ImGuiStyle ref_saved_style;

    // Default to using internal storage as reference
    static bool init = true;
    if (init && ref == NULL)
        ref_saved_style = style;
    init = false;
    if (ref == NULL)
        ref = &ref_saved_style;

    ImGui::PushItemWidth(ImGui::GetWindowWidth() * 0.50f);

    if (ImGui::ShowStyleSelector("Colors##Selector"))
        ref_saved_style = style;
    ImGui::ShowFontSelector("Fonts##Selector");

    // Simplified Settings (expose floating-pointer border sizes as boolean representing 0.0f or 1.0f)
    if (ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f"))
        style.GrabRounding = style.FrameRounding; // Make GrabRounding always the same value as FrameRounding
    { bool border = (style.WindowBorderSize > 0.0f); if (ImGui::Checkbox("WindowBorder", &border)) { style.WindowBorderSize = border ? 1.0f : 0.0f; } }
    ImGui::SameLine();
    { bool border = (style.FrameBorderSize > 0.0f);  if (ImGui::Checkbox("FrameBorder",  &border)) { style.FrameBorderSize  = border ? 1.0f : 0.0f; } }
    ImGui::SameLine();
    { bool border = (style.PopupBorderSize > 0.0f);  if (ImGui::Checkbox("PopupBorder",  &border)) { style.PopupBorderSize  = border ? 1.0f : 0.0f; } }

    // Save/Revert button
    if (ImGui::Button("Save Ref"))
        *ref = ref_saved_style = style;
    ImGui::SameLine();
    if (ImGui::Button("Revert Ref"))
        style = *ref;
    ImGui::SameLine();
    HelpMarker(
        "Save/Revert in local non-persistent storage. Default Colors definition are not affected. "
        "Use \"Export\" below to save them somewhere.");

    ImGui::Separator();

    if (ImGui::BeginTabBar("##tabs", ImGuiTabBarFlags_None))
    {
        if (ImGui::BeginTabItem("Sizes"))
        {
            ImGui::Text("Main");
            ImGui::SliderFloat2("WindowPadding", (float*)&style.WindowPadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("FramePadding", (float*)&style.FramePadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("CellPadding", (float*)&style.CellPadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemSpacing", (float*)&style.ItemSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemInnerSpacing", (float*)&style.ItemInnerSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("TouchExtraPadding", (float*)&style.TouchExtraPadding, 0.0f, 10.0f, "%.0f");
            ImGui::SliderFloat("IndentSpacing", &style.IndentSpacing, 0.0f, 30.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarSize", &style.ScrollbarSize, 1.0f, 20.0f, "%.0f");
            ImGui::SliderFloat("GrabMinSize", &style.GrabMinSize, 1.0f, 20.0f, "%.0f");
            ImGui::Text("Borders");
            ImGui::SliderFloat("WindowBorderSize", &style.WindowBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("ChildBorderSize", &style.ChildBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("PopupBorderSize", &style.PopupBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("FrameBorderSize", &style.FrameBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("TabBorderSize", &style.TabBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::Text("Rounding");
            ImGui::SliderFloat("WindowRounding", &style.WindowRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ChildRounding", &style.ChildRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("PopupRounding", &style.PopupRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarRounding", &style.ScrollbarRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("GrabRounding", &style.GrabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("LogSliderDeadzone", &style.LogSliderDeadzone, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("TabRounding", &style.TabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::Text("Alignment");
            ImGui::SliderFloat2("WindowTitleAlign", (float*)&style.WindowTitleAlign, 0.0f, 1.0f, "%.2f");
            int window_menu_button_position = style.WindowMenuButtonPosition + 1;
            if (ImGui::Combo("WindowMenuButtonPosition", (int*)&window_menu_button_position, "None\0Left\0Right\0"))
                style.WindowMenuButtonPosition = window_menu_button_position - 1;
            ImGui::Combo("ColorButtonPosition", (int*)&style.ColorButtonPosition, "Left\0Right\0");
            ImGui::SliderFloat2("ButtonTextAlign", (float*)&style.ButtonTextAlign, 0.0f, 1.0f, "%.2f");
            ImGui::SameLine(); HelpMarker("Alignment applies when a button is larger than its text content.");
            ImGui::SliderFloat2("SelectableTextAlign", (float*)&style.SelectableTextAlign, 0.0f, 1.0f, "%.2f");
            ImGui::SameLine(); HelpMarker("Alignment applies when a selectable is larger than its text content.");
            ImGui::Text("Safe Area Padding");
            ImGui::SameLine(); HelpMarker("Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured).");
            ImGui::SliderFloat2("DisplaySafeAreaPadding", (float*)&style.DisplaySafeAreaPadding, 0.0f, 30.0f, "%.0f");
            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Colors"))
        {
            static int output_dest = 0;
            static bool output_only_modified = true;
            if (ImGui::Button("Export"))
            {
                if (output_dest == 0)
                    ImGui::LogToClipboard();
                else
                    ImGui::LogToTTY();
                ImGui::LogText("ImVec4* colors = ImGui::GetStyle().Colors;" IM_NEWLINE);
                for (int i = 0; i < ImGuiCol_COUNT; i++)
                {
                    const ImVec4& col = style.Colors[i];
                    const char* name = ImGui::GetStyleColorName(i);
                    if (!output_only_modified || memcmp(&col, &ref->Colors[i], sizeof(ImVec4)) != 0)
                        ImGui::LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);" IM_NEWLINE,
                            name, 23 - (int)strlen(name), "", col.x, col.y, col.z, col.w);
                }
                ImGui::LogFinish();
            }
            ImGui::SameLine(); ImGui::SetNextItemWidth(120); ImGui::Combo("##output_type", &output_dest, "To Clipboard\0To TTY\0");
            ImGui::SameLine(); ImGui::Checkbox("Only Modified Colors", &output_only_modified);

            static ImGuiTextFilter filter;
            filter.Draw("Filter colors", ImGui::GetFontSize() * 16);

            static ImGuiColorEditFlags alpha_flags = 0;
            if (ImGui::RadioButton("Opaque", alpha_flags == ImGuiColorEditFlags_None))             { alpha_flags = ImGuiColorEditFlags_None; } ImGui::SameLine();
            if (ImGui::RadioButton("Alpha",  alpha_flags == ImGuiColorEditFlags_AlphaPreview))     { alpha_flags = ImGuiColorEditFlags_AlphaPreview; } ImGui::SameLine();
            if (ImGui::RadioButton("Both",   alpha_flags == ImGuiColorEditFlags_AlphaPreviewHalf)) { alpha_flags = ImGuiColorEditFlags_AlphaPreviewHalf; } ImGui::SameLine();
            HelpMarker(
                "In the color list:\n"
                "Left-click on color square to open color picker,\n"
                "Right-click to open edit options menu.");

            ImGui::BeginChild("##colors", ImVec2(0, 0), true, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar | ImGuiWindowFlags_NavFlattened);
            ImGui::PushItemWidth(-160);
            for (int i = 0; i < ImGuiCol_COUNT; i++)
            {
                const char* name = ImGui::GetStyleColorName(i);
                if (!filter.PassFilter(name))
                    continue;
                ImGui::PushID(i);
                ImGui::ColorEdit4("##color", (float*)&style.Colors[i], ImGuiColorEditFlags_AlphaBar | alpha_flags);
                if (memcmp(&style.Colors[i], &ref->Colors[i], sizeof(ImVec4)) != 0)
                {
                    // Tips: in a real user application, you may want to merge and use an icon font into the main font,
                    // so instead of "Save"/"Revert" you'd use icons!
                    // Read the FAQ and docs/FONTS.md about using icon fonts. It's really easy and super convenient!
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Save")) { ref->Colors[i] = style.Colors[i]; }
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Revert")) { style.Colors[i] = ref->Colors[i]; }
                }
                ImGui::SameLine(0.0f, style.ItemInnerSpacing.x);
                ImGui::TextUnformatted(name);
                ImGui::PopID();
            }
            ImGui::PopItemWidth();
            ImGui::EndChild();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Fonts"))
        {
            ImGuiIO& io = ImGui::GetIO();
            ImFontAtlas* atlas = io.Fonts;
            HelpMarker("Read FAQ and docs/FONTS.md for details on font loading.");
            ImGui::ShowFontAtlas(atlas);

            // Post-baking font scaling. Note that this is NOT the nice way of scaling fonts, read below.
            // (we enforce hard clamping manually as by default DragFloat/SliderFloat allows CTRL+Click text to get out of bounds).
            const float MIN_SCALE = 0.3f;
            const float MAX_SCALE = 2.0f;
            HelpMarker(
                "Those are old settings provided for convenience.\n"
                "However, the _correct_ way of scaling your UI is currently to reload your font at the designed size, "
                "rebuild the font atlas, and call style.ScaleAllSizes() on a reference ImGuiStyle structure.\n"
                "Using those settings here will give you poor quality results.");
            static float window_scale = 1.0f;
            ImGui::PushItemWidth(ImGui::GetFontSize() * 8);
            if (ImGui::DragFloat("window scale", &window_scale, 0.005f, MIN_SCALE, MAX_SCALE, "%.2f", ImGuiSliderFlags_AlwaysClamp)) // Scale only this window
                ImGui::SetWindowFontScale(window_scale);
            ImGui::DragFloat("global scale", &io.FontGlobalScale, 0.005f, MIN_SCALE, MAX_SCALE, "%.2f", ImGuiSliderFlags_AlwaysClamp); // Scale everything
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Rendering"))
        {
            ImGui::Checkbox("Anti-aliased lines", &style.AntiAliasedLines);
            ImGui::SameLine();
            HelpMarker("When disabling anti-aliasing lines, you'll probably want to disable borders in your style as well.");

            ImGui::Checkbox("Anti-aliased lines use texture", &style.AntiAliasedLinesUseTex);
            ImGui::SameLine();
            HelpMarker("Faster lines using texture data. Require backend to render with bilinear filtering (not point/nearest filtering).");

            ImGui::Checkbox("Anti-aliased fill", &style.AntiAliasedFill);
            ImGui::PushItemWidth(ImGui::GetFontSize() * 8);
            ImGui::DragFloat("Curve Tessellation Tolerance", &style.CurveTessellationTol, 0.02f, 0.10f, 10.0f, "%.2f");
            if (style.CurveTessellationTol < 0.10f) style.CurveTessellationTol = 0.10f;

            // When editing the "Circle Segment Max Error" value, draw a preview of its effect on auto-tessellated circles.
            ImGui::DragFloat("Circle Tessellation Max Error", &style.CircleTessellationMaxError , 0.005f, 0.10f, 5.0f, "%.2f", ImGuiSliderFlags_AlwaysClamp);
            if (ImGui::IsItemActive())
            {
                ImGui::SetNextWindowPos(ImGui::GetCursorScreenPos());
                ImGui::BeginTooltip();
                ImGui::TextUnformatted("(R = radius, N = number of segments)");
                ImGui::Spacing();
                ImDrawList* draw_list = ImGui::GetWindowDrawList();
                const float min_widget_width = ImGui::CalcTextSize("N: MMM\nR: MMM").x;
                for (int n = 0; n < 8; n++)
                {
                    const float RAD_MIN = 5.0f;
                    const float RAD_MAX = 70.0f;
                    const float rad = RAD_MIN + (RAD_MAX - RAD_MIN) * (float)n / (8.0f - 1.0f);

                    ImGui::BeginGroup();

                    ImGui::Text("R: %.f\nN: %d", rad, draw_list->_CalcCircleAutoSegmentCount(rad));

                    const float canvas_width = IM_MAX(min_widget_width, rad * 2.0f);
                    const float offset_x     = floorf(canvas_width * 0.5f);
                    const float offset_y     = floorf(RAD_MAX);

                    const ImVec2 p1 = ImGui::GetCursorScreenPos();
                    draw_list->AddCircle(ImVec2(p1.x + offset_x, p1.y + offset_y), rad, ImGui::GetColorU32(ImGuiCol_Text));
                    ImGui::Dummy(ImVec2(canvas_width, RAD_MAX * 2));

                    /*
                    const ImVec2 p2 = ImGui::GetCursorScreenPos();
                    draw_list->AddCircleFilled(ImVec2(p2.x + offset_x, p2.y + offset_y), rad, ImGui::GetColorU32(ImGuiCol_Text));
                    ImGui::Dummy(ImVec2(canvas_width, RAD_MAX * 2));
                    */

                    ImGui::EndGroup();
                    ImGui::SameLine();
                }
                ImGui::EndTooltip();
            }
            ImGui::SameLine();
            HelpMarker("When drawing circle primitives with \"num_segments == 0\" tesselation will be calculated automatically.");

            ImGui::DragFloat("Global Alpha", &style.Alpha, 0.005f, 0.20f, 1.0f, "%.2f"); // Not exposing zero here so user doesn't "lose" the UI (zero alpha clips all widgets). But application code could have a toggle to switch between zero and non-zero.
            ImGui::DragFloat("Disabled Alpha", &style.DisabledAlpha, 0.005f, 0.0f, 1.0f, "%.2f"); ImGui::SameLine(); HelpMarker("Additional alpha multiplier for disabled items (multiply over current value of Alpha).");
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
    }

    ImGui::PopItemWidth();
}